

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O3

void log_outgoing_frame(AMQP_VALUE performative)

{
  LOGGER_LOG p_Var1;
  AMQP_VALUE descriptor;
  char *pcVar2;
  
  p_Var1 = xlogging_get_log_function();
  if (p_Var1 != (LOGGER_LOG)0x0) {
    descriptor = amqpvalue_get_inplace_descriptor(performative);
    if (descriptor != (AMQP_VALUE)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_TRACE,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                  ,"log_outgoing_frame",0x14d,0,"-> ");
      }
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        pcVar2 = get_frame_type_as_string(descriptor);
        (*p_Var1)(AZ_LOG_TRACE,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                  ,"log_outgoing_frame",0x14e,0,"%s",pcVar2);
      }
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        pcVar2 = amqpvalue_to_string(performative);
        (*p_Var1)(AZ_LOG_TRACE,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                  ,"log_outgoing_frame",0x150,1,"%s",pcVar2);
        if (pcVar2 != (char *)0x0) {
          free(pcVar2);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

static void log_outgoing_frame(AMQP_VALUE performative)
{
#ifdef NO_LOGGING
    UNUSED(performative);
#else
    if (xlogging_get_log_function() != NULL)
    {
        AMQP_VALUE descriptor = amqpvalue_get_inplace_descriptor(performative);
        if (descriptor != NULL)
        {
            char* performative_as_string;
            LOG(AZ_LOG_TRACE, 0, "-> ");
            LOG(AZ_LOG_TRACE, 0, "%s", (char*)get_frame_type_as_string(descriptor));
            performative_as_string = NULL;
            LOG(AZ_LOG_TRACE, LOG_LINE, "%s", (performative_as_string = amqpvalue_to_string(performative)));
            if (performative_as_string != NULL)
            {
                free(performative_as_string);
            }
        }
    }
#endif
}